

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O1

void LSE_master_colors_max_min(int *cmax,int *cmin,int channels,uchar *uncompressed)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float sum_x [3];
  int c1 [3];
  int c0 [3];
  float sum_x2 [3];
  float local_60 [4];
  int local_50 [6];
  float local_38 [4];
  
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  local_38[2] = 0.0;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  if (0xfffffffd < channels - 5U) {
    compute_color_line_STDEV(uncompressed,channels,local_60,local_38);
    fVar10 = (float)uncompressed[2] * local_38[2] +
             (float)*uncompressed * local_38[0] + (float)uncompressed[1] * local_38[1];
    pbVar6 = uncompressed + (ulong)(uint)channels + 2;
    lVar9 = 0xf;
    fVar12 = fVar10;
    do {
      fVar13 = (float)*pbVar6 * local_38[2] +
               (float)pbVar6[-2] * local_38[0] + (float)pbVar6[-1] * local_38[1];
      fVar11 = fVar13;
      if ((fVar12 <= fVar13) && (fVar11 = fVar12, fVar10 < fVar13)) {
        fVar10 = fVar13;
      }
      pbVar6 = pbVar6 + (uint)channels;
      lVar9 = lVar9 + -1;
      fVar12 = fVar11;
    } while (lVar9 != 0);
    fVar13 = 1.0 / (local_38[2] * local_38[2] +
                   local_38[1] * local_38[1] + local_38[0] * local_38[0] + 1e-05);
    fVar12 = local_38[2] * local_60[2] + local_38[0] * local_60[0] + local_38[1] * local_60[1];
    lVar9 = 0;
    do {
      fVar1 = local_60[lVar9];
      fVar2 = local_38[lVar9];
      iVar7 = (int)((fVar10 - fVar12) * fVar13 * fVar2 + fVar1 + 0.5);
      local_50[lVar9 + 3] = iVar7;
      iVar8 = 0;
      if ((iVar7 < 0) || (iVar8 = 0xff, 0xff < iVar7)) {
        local_50[lVar9 + 3] = iVar8;
      }
      iVar8 = (int)(fVar2 * (fVar11 - fVar12) * fVar13 + fVar1 + 0.5);
      local_50[lVar9] = iVar8;
      if (iVar8 < 0) {
        iVar7 = 0;
LAB_001ca116:
        local_50[lVar9] = iVar7;
      }
      else {
        iVar7 = 0xff;
        if (0xff < iVar8) goto LAB_001ca116;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    uVar5 = (local_50[5] * 0x1f + 0x80 >> 8) + local_50[5] * 0x1f + 0x80 >> 8 |
            (local_50[4] * 0x3f + 0x80 >> 8) + local_50[4] * 0x3f + 0x80 >> 3 & 0xffffffe0U |
            ((local_50[3] * 0x1f + 0x80 >> 8) + local_50[3] * 0x1f + 0x80) * 8 & 0xfffff800U;
    uVar4 = (local_50[2] * 0x1f + 0x80 >> 8) + local_50[2] * 0x1f + 0x80 >> 8 |
            local_50[1] * 0x3f + (local_50[1] * 0x3f + 0x80 >> 8) + 0x80 >> 3 & 0xffffffe0U |
            ((local_50[0] * 0x1f + 0x80 >> 8) + local_50[0] * 0x1f + 0x80) * 8 & 0xfffff800U;
    uVar3 = uVar4;
    if ((int)uVar4 < (int)uVar5) {
      uVar3 = uVar5;
    }
    if ((int)uVar5 < (int)uVar4) {
      uVar4 = uVar5;
    }
    *cmax = uVar3;
    *cmin = uVar4;
  }
  return;
}

Assistant:

void LSE_master_colors_max_min(
		int *cmax, int *cmin,
		int channels,
		const unsigned char *const uncompressed )
{
	int i, j;
	/*	the master colors	*/
	int c0[3], c1[3];
	/*	used for fitting the line	*/
	float sum_x[] = { 0.0f, 0.0f, 0.0f };
	float sum_x2[] = { 0.0f, 0.0f, 0.0f };
	float dot_max = 1.0f, dot_min = -1.0f;
	float vec_len2 = 0.0f;
	float dot;
	/*	error check	*/
	if( (channels < 3) || (channels > 4) )
	{
		return;
	}
	compute_color_line_STDEV( uncompressed, channels, sum_x, sum_x2 );
	vec_len2 = 1.0f / ( 0.00001f +
			sum_x2[0]*sum_x2[0] + sum_x2[1]*sum_x2[1] + sum_x2[2]*sum_x2[2] );
	/*	finding the max and min vector values	*/
	dot_max =
			(
				sum_x2[0] * uncompressed[0] +
				sum_x2[1] * uncompressed[1] +
				sum_x2[2] * uncompressed[2]
			);
	dot_min = dot_max;
	for( i = 1; i < 16; ++i )
	{
		dot =
			(
				sum_x2[0] * uncompressed[i*channels+0] +
				sum_x2[1] * uncompressed[i*channels+1] +
				sum_x2[2] * uncompressed[i*channels+2]
			);
		if( dot < dot_min )
		{
			dot_min = dot;
		} else if( dot > dot_max )
		{
			dot_max = dot;
		}
	}
	/*	and the offset (from the average location)	*/
	dot = sum_x2[0]*sum_x[0] + sum_x2[1]*sum_x[1] + sum_x2[2]*sum_x[2];
	dot_min -= dot;
	dot_max -= dot;
	/*	post multiply by the scaling factor	*/
	dot_min *= vec_len2;
	dot_max *= vec_len2;
	/*	OK, build the master colors	*/
	for( i = 0; i < 3; ++i )
	{
		/*	color 0	*/
		c0[i] = (int)(0.5f + sum_x[i] + dot_max * sum_x2[i]);
		if( c0[i] < 0 )
		{
			c0[i] = 0;
		} else if( c0[i] > 255 )
		{
			c0[i] = 255;
		}
		/*	color 1	*/
		c1[i] = (int)(0.5f + sum_x[i] + dot_min * sum_x2[i]);
		if( c1[i] < 0 )
		{
			c1[i] = 0;
		} else if( c1[i] > 255 )
		{
			c1[i] = 255;
		}
	}
	/*	down_sample (with rounding?)	*/
	i = rgb_to_565( c0[0], c0[1], c0[2] );
	j = rgb_to_565( c1[0], c1[1], c1[2] );
	if( i > j )
	{
		*cmax = i;
		*cmin = j;
	} else
	{
		*cmax = j;
		*cmin = i;
	}
}